

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O0

RefAST __thiscall
antlr::ASTFactory::make
          (ASTFactory *this,
          vector<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_>
          *nodes)

{
  size_type sVar1;
  AST *pAVar2;
  ulong uVar3;
  ASTRefCount *this_00;
  vector<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_> *in_RDX;
  ASTRef *in_RDI;
  uint i;
  RefAST tail;
  RefAST *root;
  AST *in_stack_ffffffffffffff08;
  AST *in_stack_ffffffffffffff10;
  AST *in_stack_ffffffffffffff18;
  AST *in_stack_ffffffffffffff20;
  undefined1 local_78 [8];
  ASTRefCount local_70 [8];
  undefined1 local_68 [8];
  undefined1 local_60 [8];
  undefined1 local_58 [8];
  undefined1 local_50 [12];
  uint local_44;
  undefined1 local_40 [24];
  ASTRefCount<antlr::AST> local_28;
  byte local_19;
  vector<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_> *local_18
  ;
  
  local_18 = in_RDX;
  sVar1 = std::
          vector<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_>::
          size(in_RDX);
  if (sVar1 == 0) {
    ASTRefCount<antlr::AST>::ASTRefCount
              ((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  else {
    local_19 = 0;
    std::vector<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_>::
    operator[](local_18,0);
    ASTRefCount<antlr::AST>::ASTRefCount
              ((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff10,
               (ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff08);
    ASTRefCount<antlr::AST>::ASTRefCount
              ((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    pAVar2 = ASTRefCount::operator_cast_to_AST_((ASTRefCount *)in_RDI);
    if (pAVar2 != (AST *)0x0) {
      pAVar2 = ASTRefCount<antlr::AST>::operator->((ASTRefCount<antlr::AST> *)in_RDI);
      ASTRefCount<antlr::AST>::ASTRefCount
                ((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      (*pAVar2->_vptr_AST[0x14])(pAVar2,local_40);
      ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff10);
    }
    for (local_44 = 1; uVar3 = (ulong)local_44,
        sVar1 = std::
                vector<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_>
                ::size(local_18), uVar3 < sVar1; local_44 = local_44 + 1) {
      this_00 = (ASTRefCount *)
                std::
                vector<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_>
                ::operator[](local_18,(ulong)local_44);
      pAVar2 = ASTRefCount::operator_cast_to_AST_(this_00);
      if (pAVar2 != (AST *)0x0) {
        pAVar2 = ASTRefCount::operator_cast_to_AST_((ASTRefCount *)in_RDI);
        if (pAVar2 == (AST *)0x0) {
          std::
          vector<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_>::
          operator[](local_18,(ulong)local_44);
          ASTRefCount<antlr::AST>::operator=
                    ((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff20,
                     (ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff18);
          ASTRefCount<antlr::AST>::operator=
                    ((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff20,
                     (ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff18);
        }
        else {
          pAVar2 = ASTRefCount::operator_cast_to_AST_((ASTRefCount *)&local_28);
          if (pAVar2 == (AST *)0x0) {
            pAVar2 = ASTRefCount<antlr::AST>::operator->((ASTRefCount<antlr::AST> *)in_RDI);
            std::
            vector<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_>
            ::operator[](local_18,(ulong)local_44);
            ASTRefCount<antlr::AST>::ASTRefCount
                      ((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff10,
                       (ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff08);
            (*pAVar2->_vptr_AST[0x14])(pAVar2,local_50);
            ASTRefCount<antlr::AST>::~ASTRefCount
                      ((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff10);
            pAVar2 = ASTRefCount<antlr::AST>::operator->((ASTRefCount<antlr::AST> *)in_RDI);
            (*pAVar2->_vptr_AST[0xd])(local_58);
            ASTRefCount<antlr::AST>::operator=
                      ((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff20,
                       (ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff18);
            ASTRefCount<antlr::AST>::~ASTRefCount
                      ((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff10);
          }
          else {
            pAVar2 = ASTRefCount<antlr::AST>::operator->(&local_28);
            std::
            vector<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_>
            ::operator[](local_18,(ulong)local_44);
            ASTRefCount<antlr::AST>::ASTRefCount
                      ((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff10,
                       (ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff08);
            (*pAVar2->_vptr_AST[0x15])(pAVar2,local_60);
            ASTRefCount<antlr::AST>::~ASTRefCount
                      ((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff10);
            in_stack_ffffffffffffff20 = ASTRefCount<antlr::AST>::operator->(&local_28);
            (*in_stack_ffffffffffffff20->_vptr_AST[0xe])(local_68);
            ASTRefCount<antlr::AST>::operator=
                      ((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff20,
                       (ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff18);
            ASTRefCount<antlr::AST>::~ASTRefCount
                      ((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff10);
          }
        }
        in_stack_ffffffffffffff18 = ASTRefCount::operator_cast_to_AST_((ASTRefCount *)&local_28);
        if (in_stack_ffffffffffffff18 != (AST *)0x0) {
          while( true ) {
            in_stack_ffffffffffffff10 = ASTRefCount<antlr::AST>::operator->(&local_28);
            (*in_stack_ffffffffffffff10->_vptr_AST[0xe])(local_70);
            pAVar2 = ASTRefCount::operator_cast_to_AST_(local_70);
            ASTRefCount<antlr::AST>::~ASTRefCount
                      ((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff10);
            if (pAVar2 == (AST *)0x0) break;
            pAVar2 = ASTRefCount<antlr::AST>::operator->(&local_28);
            (*pAVar2->_vptr_AST[0xe])(local_78);
            ASTRefCount<antlr::AST>::operator=
                      ((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff20,
                       (ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff18);
            ASTRefCount<antlr::AST>::~ASTRefCount
                      ((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff10);
          }
          in_stack_ffffffffffffff08 = (AST *)0x0;
        }
      }
    }
    local_19 = 1;
    ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff10);
    if ((local_19 & 1) == 0) {
      ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff10);
    }
  }
  return (RefAST)in_RDI;
}

Assistant:

RefAST ASTFactory::make(ANTLR_USE_NAMESPACE(std)vector<RefAST>& nodes)
{
	if ( nodes.size() == 0 )
		return RefAST(nullASTptr);

	RefAST root = nodes[0];
	RefAST tail = RefAST(nullASTptr);

	if( root )
		root->setFirstChild(RefAST(nullASTptr));	// don't leave any old pointers set

	// link in children;
	for( unsigned int i = 1; i < nodes.size(); i++ )
	{
		if ( nodes[i] == 0 )		// ignore null nodes
			continue;

		if ( root == 0 )			// Set the root and set it up for a flat list
			root = tail = nodes[i];
		else if ( tail == 0 )
		{
			root->setFirstChild(nodes[i]);
			tail = root->getFirstChild();
		}
		else
		{
			tail->setNextSibling(nodes[i]);
			tail = tail->getNextSibling();
		}

		if( tail )	// RK: I cannot fathom why this missing check didn't bite anyone else...
		{
			// Chase tail to last sibling
			while (tail->getNextSibling())
				tail = tail->getNextSibling();
		}
	}

	return root;
}